

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void resetCursor(RtreeCursor *pCsr)

{
  undefined8 uVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 *in_RDI;
  sqlite3_rtree_query_info *pInfo;
  int i;
  sqlite3_stmt *pStmt;
  int ii;
  Rtree *pRtree;
  RtreeNode *in_stack_ffffffffffffffc8;
  Rtree *in_stack_ffffffffffffffd0;
  int local_24;
  int local_14;
  
  uVar1 = *in_RDI;
  if (in_RDI[3] != 0) {
    for (local_24 = 0; local_24 < *(int *)(in_RDI + 2); local_24 = local_24 + 1) {
      in_stack_ffffffffffffffd0 = *(Rtree **)(in_RDI[3] + (long)local_24 * 0x18 + 0x10);
      if (in_stack_ffffffffffffffd0 != (Rtree *)0x0) {
        lVar2._0_4_ = in_stack_ffffffffffffffd0->iNodeSize;
        lVar2._4_1_ = in_stack_ffffffffffffffd0->nDim;
        lVar2._5_1_ = in_stack_ffffffffffffffd0->nDim2;
        lVar2._6_1_ = in_stack_ffffffffffffffd0->eCoordType;
        lVar2._7_1_ = in_stack_ffffffffffffffd0->nBytesPerCell;
        if (lVar2 != 0) {
          (**(code **)&in_stack_ffffffffffffffd0->iNodeSize)(in_stack_ffffffffffffffd0->db);
        }
        sqlite3_free((void *)0x299eeb);
      }
    }
    sqlite3_free((void *)0x299f08);
    in_RDI[3] = 0;
  }
  for (local_14 = 0; local_14 < 5; local_14 = local_14 + 1) {
    nodeRelease(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  sqlite3_free((void *)0x299f58);
  uVar3 = in_RDI[7];
  memset(in_RDI,0,0x128);
  *in_RDI = uVar1;
  in_RDI[7] = uVar3;
  return;
}

Assistant:

static void resetCursor(RtreeCursor *pCsr){
  Rtree *pRtree = (Rtree *)(pCsr->base.pVtab);
  int ii;
  sqlite3_stmt *pStmt;
  if( pCsr->aConstraint ){
    int i;                        /* Used to iterate through constraint array */
    for(i=0; i<pCsr->nConstraint; i++){
      sqlite3_rtree_query_info *pInfo = pCsr->aConstraint[i].pInfo;
      if( pInfo ){
        if( pInfo->xDelUser ) pInfo->xDelUser(pInfo->pUser);
        sqlite3_free(pInfo);
      }
    }
    sqlite3_free(pCsr->aConstraint);
    pCsr->aConstraint = 0;
  }
  for(ii=0; ii<RTREE_CACHE_SZ; ii++) nodeRelease(pRtree, pCsr->aNode[ii]);
  sqlite3_free(pCsr->aPoint);
  pStmt = pCsr->pReadAux;
  memset(pCsr, 0, sizeof(RtreeCursor));
  pCsr->base.pVtab = (sqlite3_vtab*)pRtree;
  pCsr->pReadAux = pStmt;

}